

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O2

int Saig_SynchSequenceRun(Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,Vec_Str_t *vSequence,int fTernary)

{
  void *pvVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = vSequence->nSize / pAig->nTruePis;
  if (vSequence->nSize % pAig->nTruePis != 0) {
    __assert_fail("Vec_StrSize(vSequence) % Saig_ManPiNum(pAig) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigSynch.c"
                  ,0x16e,"int Saig_SynchSequenceRun(Aig_Man_t *, Vec_Ptr_t *, Vec_Str_t *, int)");
  }
  Saig_SynchSetConstant1(pAig,vSimInfo,1);
  if (fTernary == 0) {
    Saig_SynchInitRegsBinary(pAig,vSimInfo,1);
  }
  else {
    Saig_SynchInitRegsTernary(pAig,vSimInfo,1);
  }
  iVar5 = 0;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  for (; iVar4 != iVar5; iVar5 = iVar5 + 1) {
    Saig_SynchInitPisGiven(pAig,vSimInfo,1,vSequence->pArray + (long)iVar5 * (long)pAig->nTruePis);
    Saig_SynchTernarySimulate(pAig,vSimInfo,1);
    Saig_SynchTernaryTransferState(pAig,vSimInfo,1);
  }
  iVar4 = 0;
  iVar5 = 0;
  while( true ) {
    if (pAig->nRegs <= iVar5) {
      return iVar4;
    }
    pvVar1 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar5);
    puVar2 = (uint *)Vec_PtrEntry(vSimInfo,*(int *)((long)pvVar1 + 0x24));
    uVar3 = *puVar2 & 3;
    if (uVar3 == 2) break;
    iVar4 = iVar4 + (uint)(uVar3 == 3);
    *(ulong *)((long)pvVar1 + 0x18) =
         *(ulong *)((long)pvVar1 + 0x18) & 0xffffffffffffffef | (ulong)((*puVar2 & 1) << 4);
    iVar5 = iVar5 + 1;
  }
  __assert_fail("Value != 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigSynch.c"
                ,0x181,"int Saig_SynchSequenceRun(Aig_Man_t *, Vec_Ptr_t *, Vec_Str_t *, int)");
}

Assistant:

int Saig_SynchSequenceRun( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, Vec_Str_t * vSequence, int fTernary )
{
    unsigned * pSim;
    Aig_Obj_t * pObj;
    int Counter, nIters, Value, i;
    assert( Vec_StrSize(vSequence) % Saig_ManPiNum(pAig) == 0 );
    nIters = Vec_StrSize(vSequence) / Saig_ManPiNum(pAig);
    Saig_SynchSetConstant1( pAig, vSimInfo, 1 );
    if ( fTernary )
        Saig_SynchInitRegsTernary( pAig, vSimInfo, 1 ); 
    else
        Saig_SynchInitRegsBinary( pAig, vSimInfo, 1 ); 
    for ( i = 0; i < nIters; i++ )
    {
        Saig_SynchInitPisGiven( pAig, vSimInfo, 1, Vec_StrArray(vSequence) + i * Saig_ManPiNum(pAig) );
        Saig_SynchTernarySimulate( pAig, vSimInfo, 1 );
        Saig_SynchTernaryTransferState( pAig, vSimInfo, 1 );
    }
    // save the resulting state in the registers
    Counter = 0;
    Saig_ManForEachLo( pAig, pObj, i )
    {
        pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
        Value = pSim[0] & 3;
        assert( Value != 2 );
        Counter += (Value == 3);
        pObj->fMarkA = Value;
    }
    return Counter;
}